

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

_Bool IsFileExtension(char *fileName,char *ext)

{
  _Bool _Var1;
  char *pcVar2;
  int local_4c;
  char local_48 [4];
  int i;
  char fileExtLower [16];
  char **checkExts;
  char *pcStack_28;
  int extCount;
  char *fileExt;
  char *pcStack_18;
  _Bool result;
  char *ext_local;
  char *fileName_local;
  
  fileExt._7_1_ = 0;
  pcStack_18 = ext;
  ext_local = fileName;
  pcStack_28 = GetFileExtension(fileName);
  if (pcStack_28 != (char *)0x0) {
    checkExts._4_4_ = 0;
    fileExtLower._8_8_ = TextSplit(pcStack_18,';',(int *)((long)&checkExts + 4));
    memset(local_48,0,0x10);
    pcVar2 = TextToLower(pcStack_28);
    strcpy(local_48,pcVar2);
    for (local_4c = 0; local_4c < checkExts._4_4_; local_4c = local_4c + 1) {
      pcVar2 = TextToLower(*(char **)(fileExtLower._8_8_ + (long)local_4c * 8));
      _Var1 = TextIsEqual(local_48,pcVar2);
      if (_Var1) {
        fileExt._7_1_ = 1;
        break;
      }
    }
  }
  return (_Bool)(fileExt._7_1_ & 1);
}

Assistant:

bool IsFileExtension(const char *fileName, const char *ext)
{
    bool result = false;
    const char *fileExt = GetFileExtension(fileName);

    if (fileExt != NULL)
    {
#if defined(SUPPORT_TEXT_MANIPULATION)
        int extCount = 0;
        const char **checkExts = TextSplit(ext, ';', &extCount);

        char fileExtLower[16] = { 0 };
        strcpy(fileExtLower, TextToLower(fileExt));

        for (int i = 0; i < extCount; i++)
        {
            if (TextIsEqual(fileExtLower, TextToLower(checkExts[i])))
            {
                result = true;
                break;
            }
        }
#else
        if (strcmp(fileExt, ext) == 0) result = true;
#endif
    }

    return result;
}